

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_begin_write_cloning.c
# Opt level: O0

int zip_source_begin_write_cloning(zip_source_t *src,zip_uint64_t offset)

{
  zip_int64_t zVar1;
  zip_uint64_t offset_local;
  zip_source_t *src_local;
  
  if (src->src == (zip_source_t *)0x0) {
    if (src->write_state == ZIP_SOURCE_WRITE_OPEN) {
      zip_error_set(&src->error,0x12,0);
      src_local._4_4_ = -1;
    }
    else {
      zVar1 = _zip_source_call(src,(void *)0x0,offset,ZIP_SOURCE_BEGIN_WRITE_CLONING);
      if (zVar1 < 0) {
        src_local._4_4_ = -1;
      }
      else {
        src->write_state = ZIP_SOURCE_WRITE_OPEN;
        src_local._4_4_ = 0;
      }
    }
  }
  else {
    zip_error_set(&src->error,0x1c,0);
    src_local._4_4_ = -1;
  }
  return src_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_source_begin_write_cloning(zip_source_t *src, zip_uint64_t offset) {
    if (ZIP_SOURCE_IS_LAYERED(src)) {
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }

    if (ZIP_SOURCE_IS_OPEN_WRITING(src)) {
        zip_error_set(&src->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if (_zip_source_call(src, NULL, offset, ZIP_SOURCE_BEGIN_WRITE_CLONING) < 0) {
        return -1;
    }

    src->write_state = ZIP_SOURCE_WRITE_OPEN;

    return 0;
}